

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

uint32_t __thiscall capnp::StructSchema::Field::getDefaultValueSchemaOffset(Field *this)

{
  uint32_t uVar1;
  Reader local_78;
  Reader local_40;
  
  local_78._reader.segment = (this->proto)._reader.segment;
  local_78._reader.capTable = (this->proto)._reader.capTable;
  local_78._reader.data = (this->proto)._reader.data;
  local_78._reader.pointers = (this->proto)._reader.pointers;
  local_78._reader.dataSize = (this->proto)._reader.dataSize;
  local_78._reader.pointerCount = (this->proto)._reader.pointerCount;
  local_78._reader._38_2_ = *(undefined2 *)&(this->proto)._reader.field_0x26;
  local_78._reader.nestingLimit = (this->proto)._reader.nestingLimit;
  local_78._reader._44_4_ = *(undefined4 *)&(this->proto)._reader.field_0x2c;
  capnp::schema::Field::Slot::Reader::getDefaultValue(&local_40,&local_78);
  uVar1 = Schema::getSchemaOffset((Schema *)this,&local_40);
  return uVar1;
}

Assistant:

uint32_t StructSchema::Field::getDefaultValueSchemaOffset() const {
  return parent.getSchemaOffset(proto.getSlot().getDefaultValue());
}